

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O3

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<4>::
DecodeInternal<draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (DynamicIntegerPointsKdTreeDecoder<4> *this,uint32_t num_points,
          PointAttributeVectorOutputIterator<unsigned_int> *oit)

{
  PointIndex *pPVar1;
  int *piVar2;
  uint32_t uVar3;
  pointer pvVar4;
  void *pvVar5;
  DecodingStatus *pDVar6;
  uint32_t *puVar7;
  uint *puVar8;
  PointAttributeVectorOutputIterator<unsigned_int> *pPVar9;
  bool bVar10;
  uint32_t uVar11;
  pointer puVar12;
  uint32_t uVar13;
  _Elt_pointer pDVar14;
  ulong uVar15;
  pointer puVar16;
  uint32_t uVar17;
  RAnsBitDecoder *this_00;
  uint32_t result;
  uint32_t uVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar19;
  uint uVar20;
  int nbits;
  uint uVar21;
  uint32_t uVar22;
  VectorUint32 *levels;
  ulong uVar23;
  ulong uVar24;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>_>
  status_stack;
  DecodingStatus local_e8;
  uint32_t local_dc;
  long local_d8;
  DecodingStatus local_cc;
  PointAttributeVectorOutputIterator<unsigned_int> *local_c0;
  ulong local_b8;
  ulong local_b0;
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
  local_a8;
  ulong local_58;
  RAnsBitDecoder *local_50;
  VectorUint32 *local_48;
  ulong local_40;
  DirectBitDecoder *local_38;
  
  local_cc.num_remaining_points = 0;
  local_dc = num_points;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_cc.num_remaining_points,(allocator_type *)&local_e8);
  pvVar4 = (this->base_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar12 = *(pointer *)
             ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_a8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_a8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_a8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar5 != (void *)0x0) &&
     (operator_delete(pvVar5,(long)puVar12 - (long)pvVar5),
     local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_cc.num_remaining_points = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_cc.num_remaining_points,(allocator_type *)&local_e8);
  pvVar4 = (this->levels_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar12 = *(pointer *)
             ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_a8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_a8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_a8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar5 != (void *)0x0) &&
     (operator_delete(pvVar5,(long)puVar12 - (long)pvVar5),
     local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_cc.num_remaining_points = local_dc;
  local_cc.last_axis = 0;
  local_cc.stack_pos = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
  ::_M_initialize_map(&local_a8,0);
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>>
    ::_M_push_back_aux<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus_const&>
              ((deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>>
                *)&local_a8,&local_cc);
  }
  else {
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos = local_cc.stack_pos;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_cc.num_remaining_points;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_cc.last_axis;
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_50 = (RAnsBitDecoder *)&this->numbers_decoder_;
    local_48 = &this->p_;
    local_38 = &this->remaining_bits_decoder_;
    local_c0 = oit;
    do {
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pDVar6 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        uVar21 = pDVar6[0x29].num_remaining_points;
        uVar11 = pDVar6[0x29].last_axis;
        uVar20 = pDVar6[0x29].stack_pos;
        operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x2a;
        pDVar14 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x29;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        pDVar14 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        uVar21 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].num_remaining_points;
        uVar11 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].last_axis;
        uVar20 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].stack_pos;
      }
      uVar24 = (ulong)uVar20;
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = pDVar14;
      if (local_dc < uVar21) {
LAB_00144b2b:
        bVar10 = false;
        goto LAB_00144b2d;
      }
      pvVar19 = (this->base_stack_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar24;
      levels = (this->levels_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar24;
      local_40 = uVar24;
      uVar11 = GetAxis(this,uVar21,levels,uVar11);
      pPVar9 = local_c0;
      uVar23 = (ulong)uVar11;
      if (this->dimension_ <= uVar11) goto LAB_00144b2b;
      uVar17 = (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar23];
      local_b8 = uVar24;
      local_b0 = uVar23;
      if (this->bit_length_ == uVar17) {
        for (; uVar21 != 0; uVar21 = uVar21 - 1) {
          PointAttributeVectorOutputIterator<unsigned_int>::operator=(pPVar9,pvVar19);
          pPVar1 = &pPVar9->point_id_;
          pPVar1->value_ = pPVar1->value_ + 1;
          this->num_decoded_points_ = this->num_decoded_points_ + 1;
        }
      }
      else {
        if (2 < uVar21) {
          if (this->num_decoded_points_ <= this->num_points_) {
            local_d8 = CONCAT44(local_d8._4_4_,this->bit_length_);
            uVar24 = (ulong)(uVar20 + 1);
            local_58 = uVar24;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((this->base_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar24,pvVar19);
            piVar2 = (int *)(*(long *)&(this->base_stack_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar24].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + local_b0 * 4);
            *piVar2 = *piVar2 + (1 << ((char)local_d8 + ~(byte)uVar17 & 0x1f));
            uVar20 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar20 == 0; uVar20 = uVar20 - 1) {
              }
            }
            uVar23 = (ulong)uVar20;
            uVar20 = 0;
            this_00 = local_50;
            local_d8 = uVar24 * 3;
            do {
              bVar10 = RAnsBitDecoder::DecodeNextBit(this_00);
              uVar20 = (uint)bVar10 + uVar20 * 2;
              this_00 = this_00 + 1;
              uVar23 = uVar23 - 1;
            } while (uVar23 != 0);
            uVar17 = (uVar21 >> 1) - uVar20;
            if (uVar20 <= uVar21 >> 1) {
              uVar22 = uVar21 - uVar17;
              uVar18 = uVar17;
              if ((uVar17 != uVar22) &&
                 (puVar8 = (this->half_decoder_).pos_._M_current, uVar18 = uVar22,
                 puVar8 != (this->half_decoder_).bits_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish)) {
                uVar3 = (this->half_decoder_).num_used_bits_;
                uVar21 = *puVar8;
                uVar13 = uVar3 + 1;
                (this->half_decoder_).num_used_bits_ = uVar13;
                if (uVar13 == 0x20) {
                  (this->half_decoder_).pos_._M_current = puVar8 + 1;
                  (this->half_decoder_).num_used_bits_ = 0;
                }
                if ((0x80000000U >> ((byte)uVar3 & 0x1f) & uVar21) != 0) {
                  uVar18 = uVar17;
                  uVar17 = uVar22;
                }
              }
              pvVar4 = (this->levels_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar19 = pvVar4 + local_40;
              puVar12 = (pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start + local_b0;
              *puVar12 = *puVar12 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)&(pvVar4->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + local_d8 * 8),pvVar19);
              if (uVar18 != 0) {
                local_e8.stack_pos = (uint32_t)local_b8;
                local_e8.num_remaining_points = uVar18;
                local_e8.last_axis = uVar11;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                            *)&local_a8,&local_e8);
              }
              if (uVar17 != 0) {
                local_e8.stack_pos = (uint32_t)local_58;
                local_e8.num_remaining_points = uVar17;
                local_e8.last_axis = uVar11;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
                            *)&local_a8,&local_e8);
              }
              goto LAB_00144b17;
            }
          }
          goto LAB_00144b2b;
        }
        puVar7 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *puVar7 = uVar11;
        uVar24 = (ulong)this->dimension_;
        if (1 < this->dimension_) {
          uVar15 = 1;
          do {
            uVar20 = (int)uVar23 + 1;
            if ((int)uVar23 == (int)uVar24 + -1) {
              uVar20 = 0;
            }
            puVar7[uVar15] = uVar20;
            uVar15 = uVar15 + 1;
            uVar24 = (ulong)this->dimension_;
            uVar23 = (ulong)uVar20;
          } while (uVar15 < uVar24);
        }
        if (uVar21 != 0) {
          uVar20 = 0;
          do {
            if (this->dimension_ != 0) {
              puVar12 = (this->p_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              puVar16 = (this->axes_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar24 = 0;
              do {
                puVar12[puVar16[uVar24]] = 0;
                uVar23 = (ulong)puVar16[uVar24];
                nbits = this->bit_length_ -
                        (levels->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar23];
                if (nbits != 0) {
                  bVar10 = DirectBitDecoder::DecodeLeastSignificantBits32
                                     (local_38,nbits,puVar12 + uVar23);
                  if (!bVar10) goto LAB_00144b2b;
                  puVar12 = (this->p_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  puVar16 = (this->axes_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar23 = (ulong)puVar16[uVar24];
                }
                puVar12[uVar23] =
                     puVar12[uVar23] |
                     (pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar23];
                uVar24 = uVar24 + 1;
              } while (uVar24 < this->dimension_);
            }
            pPVar9 = local_c0;
            PointAttributeVectorOutputIterator<unsigned_int>::operator=(local_c0,local_48);
            (pPVar9->point_id_).value_ = (pPVar9->point_id_).value_ + 1;
            this->num_decoded_points_ = this->num_decoded_points_ + 1;
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar21);
        }
      }
LAB_00144b17:
    } while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  bVar10 = true;
LAB_00144b2d:
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<4>::DecodingStatus>_>
  ::~_Deque_base(&local_a8);
  return bVar10;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}